

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall QStyleSheetStyleCaches::objectDestroyed(QStyleSheetStyleCaches *this,QObject *o)

{
  long in_FS_OFFSET;
  QWidget *local_30;
  QWidget *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QWidget *)o;
  QHash<QObject_const*,QList<QCss::StyleRule>>::removeImpl<QObject_const*>
            ((QHash<QObject_const*,QList<QCss::StyleRule>> *)(this + 0x10),(QObject **)&local_28);
  QHash<QObject_const*,QHash<int,bool>>::removeImpl<QObject_const*>
            ((QHash<QObject_const*,QHash<int,bool>> *)(this + 0x18),(QObject **)&local_28);
  QHash<QObject_const*,QHash<int,QHash<unsigned_long_long,QRenderRule>>>::removeImpl<QObject_const*>
            ((QHash<QObject_const*,QHash<int,QHash<unsigned_long_long,QRenderRule>>> *)(this + 0x20)
             ,(QObject **)&local_28);
  local_30 = local_28;
  QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>::removeImpl<QWidget_const*>
            ((QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>> *)(this + 0x38),
             &local_30);
  local_30 = local_28;
  QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>::removeImpl<QWidget_const*>
            ((QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>> *)(this + 0x40),
             &local_30);
  local_30 = local_28;
  QHash<void_const*,QCss::StyleSheet>::removeImpl<void_const*>
            ((QHash<void_const*,QCss::StyleSheet> *)(this + 0x28),&local_30);
  local_30 = local_28;
  QHash<QWidget_const*,QHashDummyValue>::removeImpl<QWidget_const*>
            ((QHash<QWidget_const*,QHashDummyValue> *)(this + 0x30),&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyleCaches::objectDestroyed(QObject *o)
{
    styleRulesCache.remove(o);
    hasStyleRuleCache.remove(o);
    renderRulesCache.remove(o);
    customPaletteWidgets.remove((const QWidget *)o);
    customFontWidgets.remove(static_cast<QWidget *>(o));
    styleSheetCache.remove(o);
    autoFillDisabledWidgets.remove((const QWidget *)o);
}